

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomString::read(DomString *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  ulong uVar3;
  undefined4 in_register_00000034;
  QStringBuilder<QLatin1String,_const_QStringView_&> *str;
  long in_FS_OFFSET;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffd68;
  QStringBuilder<QLatin1String,_const_QStringView_&> *this_00;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  byte in_stack_fffffffffffffd84;
  byte in_stack_fffffffffffffd85;
  byte in_stack_fffffffffffffd86;
  byte in_stack_fffffffffffffd87;
  const_iterator local_28 [4];
  long local_8;
  
  str = (QStringBuilder<QLatin1String,_const_QStringView_&> *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  o = QList<QXmlStreamAttribute>::end
                ((QList<QXmlStreamAttribute> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1c02e0);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)this,
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT15(in_stack_fffffffffffffd85,
                                          CONCAT14(in_stack_fffffffffffffd84,
                                                   in_stack_fffffffffffffd80)))));
    QStringView::QStringView<QString,_true>
              ((QStringView *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT15(in_stack_fffffffffffffd85,
                                          CONCAT14(in_stack_fffffffffffffd84,
                                                   in_stack_fffffffffffffd80)))),
               (QString *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd87 =
         ::operator==((QStringView *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                      (QStringView *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x1c0344);
    if ((in_stack_fffffffffffffd87 & 1) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)this,
                 CONCAT17(in_stack_fffffffffffffd87,
                          CONCAT16(in_stack_fffffffffffffd86,
                                   CONCAT15(in_stack_fffffffffffffd85,
                                            CONCAT14(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80)))));
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(in_stack_fffffffffffffd87,
                          CONCAT16(in_stack_fffffffffffffd86,
                                   CONCAT15(in_stack_fffffffffffffd85,
                                            CONCAT14(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80)))),
                 (QString *)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd86 =
           ::operator==((QStringView *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                        ,(QStringView *)in_stack_fffffffffffffd68);
      QString::~QString((QString *)0x1c03f5);
      if ((in_stack_fffffffffffffd86 & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)this,
                   CONCAT17(in_stack_fffffffffffffd87,
                            CONCAT16(in_stack_fffffffffffffd86,
                                     CONCAT15(in_stack_fffffffffffffd85,
                                              CONCAT14(in_stack_fffffffffffffd84,
                                                       in_stack_fffffffffffffd80)))));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)
                   CONCAT17(in_stack_fffffffffffffd87,
                            CONCAT16(in_stack_fffffffffffffd86,
                                     CONCAT15(in_stack_fffffffffffffd85,
                                              CONCAT14(in_stack_fffffffffffffd84,
                                                       in_stack_fffffffffffffd80)))),
                   (QString *)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffd85 =
             ::operator==((QStringView *)
                          CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                          (QStringView *)in_stack_fffffffffffffd68);
        QString::~QString((QString *)0x1c04a6);
        if ((in_stack_fffffffffffffd85 & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)this,
                     CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(in_stack_fffffffffffffd86,
                                       CONCAT15(in_stack_fffffffffffffd85,
                                                CONCAT14(in_stack_fffffffffffffd84,
                                                         in_stack_fffffffffffffd80)))));
          QStringView::QStringView<QString,_true>
                    ((QStringView *)
                     CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(in_stack_fffffffffffffd86,
                                       CONCAT15(in_stack_fffffffffffffd85,
                                                CONCAT14(in_stack_fffffffffffffd84,
                                                         in_stack_fffffffffffffd80)))),
                     (QString *)in_stack_fffffffffffffd78);
          in_stack_fffffffffffffd84 =
               ::operator==((QStringView *)
                            CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            (QStringView *)in_stack_fffffffffffffd68);
          QString::~QString((QString *)0x1c0557);
          if ((in_stack_fffffffffffffd84 & 1) == 0) {
            in_stack_fffffffffffffd78 = str;
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)str,CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
            ::operator+((QLatin1String *)
                        CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                        (QStringView *)in_stack_fffffffffffffd68);
            ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffd68);
            QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffd78);
            QString::~QString((QString *)0x1c062d);
          }
          else {
            QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1c056b);
            QStringView::toString
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70))
            ;
            setAttributeId((DomString *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           (QString *)in_stack_fffffffffffffd68);
            QString::~QString((QString *)0x1c05af);
          }
        }
        else {
          QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1c04ba);
          QStringView::toString
                    ((QStringView *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          setAttributeExtraComment
                    ((DomString *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     (QString *)in_stack_fffffffffffffd68);
          QString::~QString((QString *)0x1c04fe);
        }
      }
      else {
        QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1c0409);
        QStringView::toString
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        setAttributeComment((DomString *)
                            CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            (QString *)in_stack_fffffffffffffd68);
        QString::~QString((QString *)0x1c044d);
      }
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1c0358);
      QStringView::toString
                ((QStringView *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      setAttributeNotr((DomString *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (QString *)in_stack_fffffffffffffd68);
      QString::~QString((QString *)0x1c039c);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  while (bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1c064b),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    iVar2 = QXmlStreamReader::readNext();
    if (iVar2 == 4) {
      QXmlStreamReader::name();
      this_00 = str;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd78,CONCAT44(iVar2,in_stack_fffffffffffffd70));
      ::operator+((QLatin1String *)CONCAT44(iVar2,in_stack_fffffffffffffd70),(QStringView *)this_00)
      ;
      ::QStringBuilder::operator_cast_to_QString(this_00);
      QXmlStreamReader::raiseError((QString *)this_00);
      QString::~QString((QString *)0x1c0740);
    }
    else {
      if (iVar2 == 5) break;
      if ((iVar2 == 6) && (uVar3 = QXmlStreamReader::isWhitespace(), (uVar3 & 1) == 0)) {
        QXmlStreamReader::text();
        QStringView::toString((QStringView *)CONCAT44(iVar2,in_stack_fffffffffffffd70));
        QString::append(&this->m_text);
        QString::~QString((QString *)0x1c0796);
      }
    }
  }
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1c07b4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomString::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"notr"_s) {
            setAttributeNotr(attribute.value().toString());
            continue;
        }
        if (name == u"comment"_s) {
            setAttributeComment(attribute.value().toString());
            continue;
        }
        if (name == u"extracomment"_s) {
            setAttributeExtraComment(attribute.value().toString());
            continue;
        }
        if (name == u"id"_s) {
            setAttributeId(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        case QXmlStreamReader::Characters :
            if (!reader.isWhitespace())
                m_text.append(reader.text().toString());
            break;
        default :
            break;
        }
    }
}